

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromQuadrupleAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  fltSemantics *pfVar4;
  Significand *pSVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  Significand *pSVar9;
  byte bVar10;
  bool bVar11;
  
  if (api->BitWidth != 0x80) {
    __assert_fail("api.getBitWidth()==128",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc1b,"void llvm::detail::IEEEFloat::initFromQuadrupleAPInt(const APInt &)");
  }
  uVar2 = *(api->U).pVal;
  uVar3 = (api->U).pVal[1];
  initialize(this,(fltSemantics *)semIEEEquad);
  pfVar4 = this->semantics;
  if ((pfVar4->precision & 0xffffffc0) != 0x40) {
    __assert_fail("partCount()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc23,"void llvm::detail::IEEEFloat::initFromQuadrupleAPInt(const APInt &)");
  }
  uVar7 = (ushort)(uVar3 >> 0x30) & 0x7fff;
  uVar6 = uVar3 & 0xffffffffffff;
  bVar1 = this->field_0x12;
  bVar10 = (byte)(uVar3 >> 0x3c) & 8;
  if (((uVar3 & 0x7fff000000000000) == 0 && uVar2 == 0) && uVar6 == 0) {
    bVar10 = bVar1 & 0xf0 | bVar10 | 3;
  }
  else {
    if ((uVar7 != 0x7fff || uVar2 != 0) || uVar6 != 0) {
      if ((uVar7 == 0x7fff) && (uVar2 != 0 || uVar6 != 0)) {
        this->field_0x12 = (bVar1 & 0xf0 | bVar10) + 1;
        bVar11 = 0xffffff7f < pfVar4->precision - 0x40;
        pSVar5 = (Significand *)(this->significand).parts;
        if (bVar11) {
          pSVar5 = &this->significand;
        }
        pSVar5->part = uVar2;
        pSVar5 = &this->significand;
        if (!bVar11) {
          pSVar5 = (Significand *)(this->significand).part;
        }
        pSVar5[1].part = uVar6;
        return;
      }
      this->field_0x12 = bVar1 & 0xf0 | bVar10 | 2;
      this->exponent = uVar7 + 0xc001;
      uVar8 = pfVar4->precision - 0x40;
      pSVar5 = &this->significand;
      pSVar9 = (Significand *)(this->significand).parts;
      if (0xffffff7f < uVar8) {
        pSVar9 = pSVar5;
      }
      pSVar9->part = uVar2;
      pSVar9 = (Significand *)(this->significand).part;
      if (0xffffff7f < uVar8) {
        pSVar9 = pSVar5;
      }
      pSVar9[1].part = uVar6;
      if ((uVar3 & 0x7fff000000000000) != 0) {
        if (uVar8 < 0xffffff80) {
          pSVar5 = (Significand *)pSVar5->part;
        }
        pSVar5[1].part = pSVar5[1].part | 0x1000000000000;
        return;
      }
      this->exponent = -0x3ffe;
      return;
    }
    bVar10 = bVar1 & 0xf0 | bVar10;
  }
  this->field_0x12 = bVar10;
  return;
}

Assistant:

void IEEEFloat::initFromQuadrupleAPInt(const APInt &api) {
  assert(api.getBitWidth()==128);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  uint64_t myexponent = (i2 >> 48) & 0x7fff;
  uint64_t mysignificand  = i1;
  uint64_t mysignificand2 = i2 & 0xffffffffffffLL;

  initialize(&semIEEEquad);
  assert(partCount()==2);

  sign = static_cast<unsigned int>(i2>>63);
  if (myexponent==0 &&
      (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7fff &&
             (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7fff &&
             (mysignificand!=0 || mysignificand2 !=0)) {
    // exponent meaningless
    category = fcNaN;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
  } else {
    category = fcNormal;
    exponent = myexponent - 16383;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
    if (myexponent==0)          // denormal
      exponent = -16382;
    else
      significandParts()[1] |= 0x1000000000000LL;  // integer bit
  }
}